

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

void __thiscall CDBWrapper::CDBWrapper(CDBWrapper *this,DBParams *params)

{
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  undefined1 uVar1;
  bool fSync;
  LevelDBContext *pLVar2;
  LevelDBContext *pLVar3;
  LevelDBContext *pLVar4;
  LevelDBContext *pLVar5;
  Env *pEVar6;
  LevelDBContext *pLVar7;
  LevelDBContext *pLVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  long in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_00;
  long in_FS_OFFSET;
  bool key_exists;
  vector<unsigned_char,_std::allocator<unsigned_char>_> new_key;
  Status status;
  Status result;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffb4c;
  char *in_stack_fffffffffffffb50;
  char *pcVar10;
  Span<const_unsigned_char> *in_stack_fffffffffffffb58;
  allocator_type *in_stack_fffffffffffffb60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb68;
  CDBWrapper *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  path *in_stack_fffffffffffffb80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *value;
  undefined7 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb97;
  Status *in_stack_fffffffffffffb98;
  CDBWrapper *this_00;
  LogFlags in_stack_fffffffffffffbb0;
  Options *in_stack_fffffffffffffbb8;
  int iVar11;
  string *in_stack_fffffffffffffbc0;
  Env *in_stack_fffffffffffffbd0;
  LevelDBContext *in_stack_fffffffffffffbd8;
  LevelDBContext *in_stack_fffffffffffffbe0;
  LevelDBContext *in_stack_fffffffffffffbe8;
  ConstevalFormatString<2U> in_stack_fffffffffffffbf8;
  Level in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  undefined1 local_2c2 [202];
  Comparator *local_1f8;
  undefined8 uStack_1f0;
  Env *local_1e8;
  Logger *pLStack_1e0;
  size_t local_1d8;
  undefined8 uStack_1d0;
  Cache *local_1c8;
  size_t sStack_1c0;
  undefined8 local_1b8;
  size_t sStack_1b0;
  undefined8 local_1a8;
  FilterPolicy *pFStack_1a0;
  allocator_type local_158 [32];
  Span<const_unsigned_char> local_138 [2];
  Span<const_unsigned_char> local_118 [6];
  Span<const_unsigned_char> local_b8 [11];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<LevelDBContext>();
  std::filesystem::__cxx11::path::stem(in_stack_fffffffffffffb80);
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (path *)0xf2e9fc);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffb50);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::filesystem::__cxx11::path::~path
            ((path *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  fs::path::path((path *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
                 (path *)0xf2ea69);
  *(byte *)(in_RDI + 0x68) = *(byte *)(in_RSI + 0x30) & 1;
  pLVar2 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  pLVar2->penv = (Env *)0x0;
  pLVar2 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  (pLVar2->readoptions).verify_checksums = true;
  pLVar2 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  (pLVar2->iteroptions).verify_checksums = true;
  pLVar2 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  (pLVar2->iteroptions).fill_cache = false;
  pLVar3 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  (pLVar3->syncoptions).sync = true;
  GetOptions((size_t)in_stack_fffffffffffffb58);
  pLVar4 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  (pLVar4->options).compression = (undefined4)local_1a8;
  (pLVar4->options).reuse_logs = (bool)local_1a8._4_1_;
  *(undefined3 *)&(pLVar4->options).field_0x55 = local_1a8._5_3_;
  (pLVar4->options).filter_policy = pFStack_1a0;
  *(undefined8 *)&(pLVar4->options).block_restart_interval = local_1b8;
  (pLVar4->options).max_file_size = sStack_1b0;
  (pLVar4->options).block_cache = local_1c8;
  (pLVar4->options).block_size = sStack_1c0;
  (pLVar4->options).write_buffer_size = local_1d8;
  *(undefined8 *)&(pLVar4->options).max_open_files = uStack_1d0;
  (pLVar4->options).env = local_1e8;
  (pLVar4->options).info_log = pLStack_1e0;
  (pLVar4->options).comparator = local_1f8;
  (pLVar4->options).create_if_missing = (bool)(undefined1)uStack_1f0;
  (pLVar4->options).error_if_exists = (bool)uStack_1f0._1_1_;
  (pLVar4->options).paranoid_checks = (bool)uStack_1f0._2_1_;
  *(undefined5 *)&(pLVar4->options).field_0xb = uStack_1f0._3_5_;
  pLVar5 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  (pLVar5->options).create_if_missing = true;
  if ((*(byte *)(in_RSI + 0x30) & 1) == 0) {
    if ((*(byte *)(in_RSI + 0x31) & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb50 = "Wiping LevelDB in %s\n";
      uVar9 = 2;
      logging_function._M_str = (char *)pLVar2;
      logging_function._M_len = (size_t)pLVar3;
      source_file._M_str = (char *)pLVar4;
      source_file._M_len = (size_t)pLVar5;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                 in_stack_fffffffffffffbb0,in_stack_fffffffffffffcf0,
                 (ConstevalFormatString<1U>)in_stack_fffffffffffffbf8.fmt,in_stack_fffffffffffffd00)
      ;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb4c,uVar9));
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffb50);
      DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
      leveldb::DestroyDB(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb4c,uVar9));
      HandleError(in_stack_fffffffffffffb98);
      leveldb::Status::~Status((Status *)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
    }
    iVar11 = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
    TryCreateDirectories((path *)in_stack_fffffffffffffb70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb58 = local_b8;
    in_stack_fffffffffffffb50 = "Opening LevelDB in %s\n";
    in_stack_fffffffffffffb48 = 2;
    logging_function_00._M_str = (char *)pLVar2;
    logging_function_00._M_len = (size_t)pLVar3;
    source_file_00._M_str = (char *)pLVar4;
    source_file_00._M_len = (size_t)pLVar5;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,iVar11,in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffcf0,(ConstevalFormatString<1U>)in_stack_fffffffffffffbf8.fmt,
               in_stack_fffffffffffffd00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  }
  else {
    in_stack_fffffffffffffbf8.fmt = (char *)leveldb::Env::Default();
    pEVar6 = leveldb::NewMemEnv((Env *)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffbe8 =
         DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    in_stack_fffffffffffffbe8->penv = pEVar6;
    in_stack_fffffffffffffbe0 =
         DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    in_stack_fffffffffffffbd0 = in_stack_fffffffffffffbe0->penv;
    in_stack_fffffffffffffbd8 =
         DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    (in_stack_fffffffffffffbd8->options).env = in_stack_fffffffffffffbd0;
  }
  pLVar7 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  iVar11 = (int)((ulong)&pLVar7->options >> 0x20);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffb50);
  pLVar7 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  leveldb::DB::Open((Options *)in_stack_fffffffffffffbe8,(string *)in_stack_fffffffffffffbe0,
                    (DB **)in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  HandleError(in_stack_fffffffffffffb98);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
  pcVar10 = "Opened LevelDB successfully\n";
  uVar9 = 2;
  logging_function_01._M_str = (char *)pLVar2;
  logging_function_01._M_len = (size_t)pLVar3;
  source_file_01._M_str = (char *)pLVar4;
  source_file_01._M_len = (size_t)pLVar5;
  LogPrintFormatInternal<>
            (logging_function_01,source_file_01,iVar11,(LogFlags)pLVar7,in_stack_fffffffffffffcf0,
             (ConstevalFormatString<0U>)in_stack_fffffffffffffbf8.fmt);
  if ((*(byte *)(in_RSI + 0x33) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    fs::PathToString_abi_cxx11_((path *)pcVar10);
    pcVar10 = "Starting database compaction of %s\n";
    uVar9 = 2;
    logging_function_02._M_str = (char *)pLVar2;
    logging_function_02._M_len = (size_t)pLVar3;
    source_file_02._M_str = (char *)pLVar4;
    source_file_02._M_len = (size_t)pLVar5;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,iVar11,(LogFlags)pLVar7,in_stack_fffffffffffffcf0,
               (ConstevalFormatString<1U>)in_stack_fffffffffffffbf8.fmt,in_stack_fffffffffffffd00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,uVar9));
    pLVar8 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
    (*pLVar8->pdb->_vptr_DB[0xb])(pLVar8->pdb,0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    fs::PathToString_abi_cxx11_((path *)pcVar10);
    in_stack_fffffffffffffb58 = local_118;
    pcVar10 = "Finished database compaction of %s\n";
    uVar9 = 2;
    logging_function_03._M_str = (char *)pLVar2;
    logging_function_03._M_len = (size_t)pLVar3;
    source_file_03._M_str = (char *)pLVar4;
    source_file_03._M_len = (size_t)pLVar5;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_03,source_file_03,iVar11,(LogFlags)pLVar7,in_stack_fffffffffffffcf0,
               (ConstevalFormatString<1U>)in_stack_fffffffffffffbf8.fmt,in_stack_fffffffffffffd00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,uVar9));
  }
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  local_2c2[1] = 0;
  this_00 = (CDBWrapper *)local_2c2;
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
             (size_type)in_stack_fffffffffffffb70,(value_type_conflict3 *)in_stack_fffffffffffffb68,
             in_stack_fffffffffffffb60);
  key_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28);
  value = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_2c2 + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
  uVar1 = Read<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (this_00,key,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffb97,in_stack_fffffffffffffb90));
  if (((!(bool)uVar1) && ((*(byte *)(in_RSI + 0x32) & 1) != 0)) &&
     (fSync = IsEmpty(in_stack_fffffffffffffb70), fSync)) {
    CreateObfuscateKey((CDBWrapper *)CONCAT17(fSync,in_stack_fffffffffffffb78));
    Write<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((CDBWrapper *)CONCAT17(uVar1,in_stack_fffffffffffffb90),key_00,value,fSync);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    fs::PathToString_abi_cxx11_((path *)pcVar10);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (in_stack_fffffffffffffb58,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar10,
               (type)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
    s.m_size = (size_t)in_stack_fffffffffffffbd8;
    s.m_data = (uchar *)in_stack_fffffffffffffbd0;
    HexStr_abi_cxx11_(s);
    in_stack_fffffffffffffb60 = local_158;
    in_stack_fffffffffffffb58 = local_138;
    pcVar10 = "Wrote new obfuscate key for %s: %s\n";
    uVar9 = 2;
    logging_function_04._M_str = (char *)pLVar2;
    logging_function_04._M_len = (size_t)pLVar3;
    source_file_04._M_str = (char *)pLVar4;
    source_file_04._M_len = (size_t)pLVar5;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (logging_function_04,source_file_04,iVar11,(LogFlags)pLVar7,in_stack_fffffffffffffcf0,
               in_stack_fffffffffffffbf8,in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,uVar9));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,uVar9));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb58);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
  fs::PathToString_abi_cxx11_((path *)pcVar10);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_fffffffffffffb58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar10,
             (type)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
  s_00.m_size = (size_t)in_stack_fffffffffffffbd8;
  s_00.m_data = (uchar *)in_stack_fffffffffffffbd0;
  HexStr_abi_cxx11_(s_00);
  uVar9 = 2;
  logging_function_05._M_str = (char *)pLVar2;
  logging_function_05._M_len = (size_t)pLVar3;
  source_file_05._M_str = (char *)pLVar4;
  source_file_05._M_len = (size_t)pLVar5;
  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
            (logging_function_05,source_file_05,iVar11,(LogFlags)pLVar7,in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffbf8,in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,uVar9));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,uVar9));
  leveldb::Status::~Status((Status *)CONCAT44(in_stack_fffffffffffffb4c,uVar9));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

CDBWrapper::CDBWrapper(const DBParams& params)
    : m_db_context{std::make_unique<LevelDBContext>()}, m_name{fs::PathToString(params.path.stem())}, m_path{params.path}, m_is_memory{params.memory_only}
{
    DBContext().penv = nullptr;
    DBContext().readoptions.verify_checksums = true;
    DBContext().iteroptions.verify_checksums = true;
    DBContext().iteroptions.fill_cache = false;
    DBContext().syncoptions.sync = true;
    DBContext().options = GetOptions(params.cache_bytes);
    DBContext().options.create_if_missing = true;
    if (params.memory_only) {
        DBContext().penv = leveldb::NewMemEnv(leveldb::Env::Default());
        DBContext().options.env = DBContext().penv;
    } else {
        if (params.wipe_data) {
            LogPrintf("Wiping LevelDB in %s\n", fs::PathToString(params.path));
            leveldb::Status result = leveldb::DestroyDB(fs::PathToString(params.path), DBContext().options);
            HandleError(result);
        }
        TryCreateDirectories(params.path);
        LogPrintf("Opening LevelDB in %s\n", fs::PathToString(params.path));
    }
    // PathToString() return value is safe to pass to leveldb open function,
    // because on POSIX leveldb passes the byte string directly to ::open(), and
    // on Windows it converts from UTF-8 to UTF-16 before calling ::CreateFileW
    // (see env_posix.cc and env_windows.cc).
    leveldb::Status status = leveldb::DB::Open(DBContext().options, fs::PathToString(params.path), &DBContext().pdb);
    HandleError(status);
    LogPrintf("Opened LevelDB successfully\n");

    if (params.options.force_compact) {
        LogPrintf("Starting database compaction of %s\n", fs::PathToString(params.path));
        DBContext().pdb->CompactRange(nullptr, nullptr);
        LogPrintf("Finished database compaction of %s\n", fs::PathToString(params.path));
    }

    // The base-case obfuscation key, which is a noop.
    obfuscate_key = std::vector<unsigned char>(OBFUSCATE_KEY_NUM_BYTES, '\000');

    bool key_exists = Read(OBFUSCATE_KEY_KEY, obfuscate_key);

    if (!key_exists && params.obfuscate && IsEmpty()) {
        // Initialize non-degenerate obfuscation if it won't upset
        // existing, non-obfuscated data.
        std::vector<unsigned char> new_key = CreateObfuscateKey();

        // Write `new_key` so we don't obfuscate the key with itself
        Write(OBFUSCATE_KEY_KEY, new_key);
        obfuscate_key = new_key;

        LogPrintf("Wrote new obfuscate key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
    }

    LogPrintf("Using obfuscation key for %s: %s\n", fs::PathToString(params.path), HexStr(obfuscate_key));
}